

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# goeslrit.cc
# Opt level: O3

int main(int argc,char **argv)

{
  long *plVar1;
  _Rb_tree_color _Var2;
  SessionPDU *pSVar3;
  pointer puVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  FileReader *this;
  _Rb_tree_header *p_Var8;
  undefined8 *puVar9;
  ostream *poVar10;
  int *piVar11;
  size_t sVar12;
  _Base_ptr p_Var13;
  _Base_ptr p_Var14;
  _Base_ptr p_Var15;
  long lVar16;
  char *pcVar17;
  ulong uVar18;
  undefined8 uVar19;
  _Base_ptr p_Var20;
  pointer spdu;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> name;
  vector<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
  spdus;
  Options opts;
  Assembler assembler;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  array<unsigned_char,_892UL> buf;
  long *local_6e0;
  long local_6d8;
  long local_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  ulong *local_6b8;
  string local_6b0;
  vector<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
  local_690;
  Options local_678;
  _Rb_tree<int,_std::pair<const_int,_assembler::VirtualChannel>,_std::_Select1st<std::pair<const_int,_assembler::VirtualChannel>_>,_std::less<int>,_std::allocator<std::pair<const_int,_assembler::VirtualChannel>_>_>
  local_5e0;
  ulong *local_5b0;
  long local_5a8;
  ulong local_5a0 [2];
  byte abStack_590 [216];
  ios_base local_4b8 [268];
  undefined8 local_3ac;
  
  parseOptions(&local_678,argc,argv);
  if (local_678.nanomsg._M_string_length == 0) {
    if (local_678.files.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_678.files.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"No input specified",0x12);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'x');
      std::ostream::put('x');
      iVar6 = 1;
      std::ostream::flush();
      goto LAB_0012191a;
    }
    this = (FileReader *)operator_new(0x228);
    FileReader::FileReader(this,&local_678.files);
  }
  else {
    this = (FileReader *)operator_new(0x10);
    NanomsgReader::NanomsgReader((NanomsgReader *)this,&local_678.nanomsg);
  }
  util::mkdirp(&local_678.out);
  ::assembler::Assembler::Assembler((Assembler *)&local_5e0);
  local_6b8 = _VTT;
  local_6c0 = ___throw_bad_array_new_length;
LAB_0012146c:
  iVar6 = (*(this->super_PacketReader)._vptr_PacketReader[2])(this,&local_3ac);
  if ((char)iVar6 != '\0') {
    if (local_678.vcids._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)
    goto code_r0x0012148c;
    goto LAB_001214e6;
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_assembler::VirtualChannel>,_std::_Select1st<std::pair<const_int,_assembler::VirtualChannel>_>,_std::less<int>,_std::allocator<std::pair<const_int,_assembler::VirtualChannel>_>_>
  ::~_Rb_tree(&local_5e0);
  (*(this->super_PacketReader)._vptr_PacketReader[1])();
  iVar6 = 0;
LAB_0012191a:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_678.out._M_dataplus._M_p != &local_678.out.field_2) {
    operator_delete(local_678.out._M_dataplus._M_p,local_678.out.field_2._M_allocated_capacity + 1);
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_678.vcids._M_t);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_678.files);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_678.nanomsg._M_dataplus._M_p != &local_678.nanomsg.field_2) {
    operator_delete(local_678.nanomsg._M_dataplus._M_p,
                    local_678.nanomsg.field_2._M_allocated_capacity + 1);
  }
  return iVar6;
code_r0x0012148c:
  if (local_678.vcids._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    uVar7 = local_3ac._1_1_ & 0x3f;
    p_Var13 = local_678.vcids._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var15 = &local_678.vcids._M_t._M_impl.super__Rb_tree_header._M_header;
    do {
      p_Var20 = p_Var15;
      p_Var14 = p_Var13;
      _Var2 = p_Var14[1]._M_color;
      p_Var15 = p_Var14;
      if ((int)_Var2 < (int)uVar7) {
        p_Var15 = p_Var20;
      }
      p_Var13 = (&p_Var14->_M_left)[(int)_Var2 < (int)uVar7];
    } while ((&p_Var14->_M_left)[(int)_Var2 < (int)uVar7] != (_Base_ptr)0x0);
    if ((_Rb_tree_header *)p_Var15 != &local_678.vcids._M_t._M_impl.super__Rb_tree_header) {
      if ((int)_Var2 < (int)uVar7) {
        p_Var14 = p_Var20;
      }
      if ((int)p_Var14[1]._M_color <= (int)uVar7) {
LAB_001214e6:
        local_5b0 = &local_3ac;
        ::assembler::Assembler::process(&local_690,(Assembler *)&local_5e0,(VCDU *)&local_5b0);
        puVar4 = local_690.
                 super__Vector_base<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (spdu = local_690.
                    super__Vector_base<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; spdu != puVar4; spdu = spdu + 1) {
          pSVar3 = (spdu->_M_t).
                   super___uniq_ptr_impl<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_assembler::SessionPDU_*,_std::default_delete<assembler::SessionPDU>_>
                   .super__Head_base<0UL,_assembler::SessionPDU_*,_false>._M_head_impl;
          p_Var13 = (pSVar3->m_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          if (p_Var13 != (_Base_ptr)0x0) {
            p_Var8 = &(pSVar3->m_)._M_t._M_impl.super__Rb_tree_header;
            p_Var15 = &p_Var8->_M_header;
            do {
              if (3 < (int)p_Var13[1]._M_color) {
                p_Var15 = p_Var13;
              }
              p_Var13 = (&p_Var13->_M_left)[(int)p_Var13[1]._M_color < 4];
            } while (p_Var13 != (_Base_ptr)0x0);
            if (((_Rb_tree_header *)p_Var15 != p_Var8) && ((int)p_Var15[1]._M_color < 5)) {
              bVar5 = filter(&local_678,spdu);
              if (!bVar5) {
                pcVar17 = "Writing: ";
                if (local_678.dryrun != false) {
                  pcVar17 = "Writing (dry run): ";
                }
                lVar16 = 9;
                if (local_678.dryrun != false) {
                  lVar16 = 0x13;
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,pcVar17,lVar16);
                local_5b0 = local_5a0;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_5b0,local_678.out._M_dataplus._M_p,
                           local_678.out._M_dataplus._M_p + local_678.out._M_string_length);
                std::__cxx11::string::append((char *)&local_5b0);
                filename_abi_cxx11_(&local_6b0,spdu);
                uVar18 = 0xf;
                if (local_5b0 != local_5a0) {
                  uVar18 = local_5a0[0];
                }
                if (uVar18 < local_6b0._M_string_length + local_5a8) {
                  uVar19 = 0xf;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_6b0._M_dataplus._M_p != &local_6b0.field_2) {
                    uVar19 = local_6b0.field_2._M_allocated_capacity;
                  }
                  if ((ulong)uVar19 < local_6b0._M_string_length + local_5a8) goto LAB_00121639;
                  puVar9 = (undefined8 *)
                           std::__cxx11::string::replace
                                     ((ulong)&local_6b0,0,(char *)0x0,(ulong)local_5b0);
                }
                else {
LAB_00121639:
                  puVar9 = (undefined8 *)
                           std::__cxx11::string::_M_append
                                     ((char *)&local_5b0,(ulong)local_6b0._M_dataplus._M_p);
                }
                plVar1 = puVar9 + 2;
                if ((long *)*puVar9 == plVar1) {
                  local_6d0 = *plVar1;
                  uStack_6c8 = puVar9[3];
                  local_6e0 = &local_6d0;
                }
                else {
                  local_6d0 = *plVar1;
                  local_6e0 = (long *)*puVar9;
                }
                local_6d8 = puVar9[1];
                *puVar9 = plVar1;
                puVar9[1] = 0;
                *(undefined1 *)plVar1 = 0;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_6b0._M_dataplus._M_p != &local_6b0.field_2) {
                  operator_delete(local_6b0._M_dataplus._M_p,
                                  local_6b0.field_2._M_allocated_capacity + 1);
                }
                if (local_5b0 != local_5a0) {
                  operator_delete(local_5b0,local_5a0[0] + 1);
                }
                poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,(char *)local_6e0,local_6d8);
                std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
                if (local_678.dryrun == false) {
                  std::ofstream::ofstream((string *)&local_5b0,(string *)&local_6e0,_S_bin);
                  std::ostream::write((char *)&local_5b0,
                                      *(long *)&(((spdu->_M_t).
                                                  super___uniq_ptr_impl<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_assembler::SessionPDU_*,_std::default_delete<assembler::SessionPDU>_>
                                                  .
                                                  super__Head_base<0UL,_assembler::SessionPDU_*,_false>
                                                 ._M_head_impl)->buf_).
                                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                ._M_impl);
                  std::ofstream::close();
                  if ((abStack_590[local_5b0[-3]] & 5) == 0) {
                    local_5b0 = local_6b8;
                    *(undefined8 *)((long)&local_5b0 + local_6b8[-3]) = local_6c0;
                    std::filebuf::~filebuf((filebuf *)&local_5a8);
                    std::ios_base::~ios_base(local_4b8);
                    goto LAB_001217cf;
                  }
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"(",1);
                  piVar11 = __errno_location();
                  pcVar17 = strerror(*piVar11);
                  if (pcVar17 == (char *)0x0) {
                    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x15a360);
                  }
                  else {
                    sVar12 = strlen(pcVar17);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,pcVar17,sVar12);
                  }
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
                  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
                  std::ostream::put('`');
                  std::ostream::flush();
                  local_5b0 = local_6b8;
                  *(undefined8 *)((long)&local_5b0 + local_6b8[-3]) = local_6c0;
                  std::filebuf::~filebuf((filebuf *)&local_5a8);
                  std::ios_base::~ios_base(local_4b8);
                }
                else {
LAB_001217cf:
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"(",1);
                  poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar10," bytes)",7);
                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
                  std::ostream::put((char)poVar10);
                  std::ostream::flush();
                }
                if (local_6e0 != &local_6d0) {
                  operator_delete(local_6e0,local_6d0 + 1);
                }
              }
            }
          }
        }
        std::
        vector<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
        ::~vector(&local_690);
      }
    }
  }
  goto LAB_0012146c;
}

Assistant:

int main(int argc, char** argv) {
  auto opts = parseOptions(argc, argv);

  // Create packet reader depending on options
  std::unique_ptr<PacketReader> reader;
  if (!opts.nanomsg.empty()) {
    reader = std::make_unique<NanomsgReader>(opts.nanomsg);
  } else if (!opts.files.empty()) {
    reader = std::make_unique<FileReader>(opts.files);
  } else {
    std::cerr << "No input specified" << std::endl;
    return 1;
  }

  // Make sure output directory exists
  mkdirp(opts.out);

  // Pass packets to packet assembler
  assembler::Assembler assembler;
  std::array<uint8_t, 892> buf;
  while (reader->nextPacket(buf)) {
    VCDU vcdu(buf);

    // Don't process VCDU if VCID was not specified
    if (!opts.vcids.empty() && opts.vcids.count(vcdu.getVCID()) == 0) {
      continue;
    }

    auto spdus = assembler.process(buf);
    for (auto& spdu : spdus) {

      // Skip stuff without filename
      if (!spdu->hasHeader<lrit::AnnotationHeader>()) {
        continue;
      }

      // Check if we should include this file
      if (filter(opts, spdu)) {
        continue;
      }

      if (opts.dryrun) {
        std::cout << "Writing (dry run): ";
      } else {
        std::cout << "Writing: ";
      }

      const auto name = opts.out + "/" + filename(spdu);
      std::cout << name << " ";

      if (!opts.dryrun) {
        std::ofstream fout(name, std::ofstream::binary);
        const auto& buf = spdu->get();
        fout.write((const char*)buf.data(), buf.size());
        fout.close();
        if (fout.fail()) {
          std::cout << "(" << strerror(errno) << ")" << std::endl;
          continue;
        }
      }

      std::cout << "(" << spdu->size() << " bytes)" << std::endl;
    }
  }
}